

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.cpp
# Opt level: O0

void __thiscall stk::StkFrames::StkFrames(StkFrames *this,uint nFrames,uint nChannels)

{
  StkFloat *pSVar1;
  StkFloat SVar2;
  uint nChannels_local;
  uint nFrames_local;
  StkFrames *this_local;
  
  this->data_ = (StkFloat *)0x0;
  this->nFrames_ = (ulong)nFrames;
  this->nChannels_ = nChannels;
  this->size_ = this->nFrames_ * (ulong)this->nChannels_;
  this->bufferSize_ = this->size_;
  if (this->size_ != 0) {
    pSVar1 = (StkFloat *)calloc(this->size_,8);
    this->data_ = pSVar1;
  }
  SVar2 = Stk::sampleRate();
  this->dataRate_ = SVar2;
  return;
}

Assistant:

StkFrames :: StkFrames( unsigned int nFrames, unsigned int nChannels )
  : data_( 0 ), nFrames_( nFrames ), nChannels_( nChannels )
{
  size_ = nFrames_ * nChannels_;
  bufferSize_ = size_;

  if ( size_ > 0 ) {
    data_ = (StkFloat *) calloc( size_, sizeof( StkFloat ) );
#if defined(_STK_DEBUG_)
    if ( data_ == NULL ) {
      std::string error = "StkFrames: memory allocation error in constructor!";
      Stk::handleError( error, StkError::MEMORY_ALLOCATION );
    }
#endif
  }

  dataRate_ = Stk::sampleRate();
}